

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void Commands::Inventory(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  World *pWVar1;
  Character_Item CVar2;
  Character *pCVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  const_reference pvVar8;
  Character *pCVar9;
  mapped_type *this;
  long lVar10;
  size_type sVar11;
  size_type sVar12;
  list<Character_Item,_std::allocator<Character_Item>_> *plVar13;
  reference pCVar14;
  allocator<char> local_339;
  string local_338;
  string local_318;
  Character_Item local_2f8;
  Character_Item item_1;
  iterator __end3_1;
  iterator __begin3_1;
  list<Character_Item,_std::allocator<Character_Item>_> *__range3_1;
  Character_Item item;
  iterator __end3;
  iterator __begin3;
  list<Character_Item,_std::allocator<Character_Item>_> *__range3;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  allocator<char> local_171;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  PacketBuilder reply;
  undefined1 local_e0 [8];
  string name;
  key_type local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_40;
  Character *local_20;
  Character *victim;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  pWVar1 = from->world;
  victim = from;
  from_local = (Character *)arguments;
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](arguments,0);
  std::__cxx11::string::string((string *)&local_40,(string *)pvVar8);
  pCVar9 = World::GetCharacter(pWVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pCVar3 = victim;
  local_20 = pCVar9;
  if (pCVar9 == (Character *)0x0) {
    pWVar1 = victim->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"character_not_found",&local_91);
    I18N::Format<>(&local_70,&pWVar1->i18n,&local_90);
    (*(pCVar3->super_Command_Source)._vptr_Command_Source[5])(pCVar3,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  else {
    uVar5 = (**(pCVar9->super_Command_Source)._vptr_Command_Source)();
    pWVar1 = victim->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"cmdprotect",(allocator<char> *)(name.field_2._M_local_buf + 0xf)
              );
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->admin_config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_b8);
    iVar6 = util::variant::operator_cast_to_int(this);
    bVar4 = true;
    if (iVar6 <= (int)(uVar5 & 0xff)) {
      uVar5 = (**(local_20->super_Command_Source)._vptr_Command_Source)();
      uVar7 = (**(victim->super_Command_Source)._vptr_Command_Source)();
      bVar4 = (uVar5 & 0xff) <= (uVar7 & 0xff);
    }
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    pCVar3 = victim;
    if (bVar4) {
      (*(local_20->super_Command_Source)._vptr_Command_Source[2])();
      util::ucfirst((string *)local_e0,(string *)&reply.add_size);
      std::__cxx11::string::~string((string *)&reply.add_size);
      lVar10 = std::__cxx11::string::length();
      sVar11 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                         (&local_20->inventory);
      sVar12 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                         (&local_20->bank);
      PacketBuilder::PacketBuilder
                ((PacketBuilder *)local_130,PACKET_ADMININTERACT,PACKET_LIST,
                 sVar12 * 7 + 0x20 + lVar10 + sVar11 * 6);
      switch(local_20->admin) {
      case ADMIN_GUIDE:
        pWVar1 = victim->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"light_guide_title",&local_249);
        I18N::Format<std::__cxx11::string&>
                  (&local_228,&pWVar1->i18n,&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
        PacketBuilder::AddString((PacketBuilder *)local_130,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator(&local_249);
        break;
      case ADMIN_GUARDIAN:
        pWVar1 = victim->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,"guardian_title",&local_201);
        I18N::Format<std::__cxx11::string&>
                  (&local_1e0,&pWVar1->i18n,&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
        PacketBuilder::AddString((PacketBuilder *)local_130,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator(&local_201);
        break;
      case ADMIN_GM:
        pWVar1 = victim->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"game_master_title",&local_1b9);
        I18N::Format<std::__cxx11::string&>
                  (&local_198,&pWVar1->i18n,&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
        PacketBuilder::AddString((PacketBuilder *)local_130,&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator(&local_1b9);
        break;
      case ADMIN_HGM:
        pWVar1 = victim->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"high_game_master_title",&local_171);
        I18N::Format<std::__cxx11::string&>
                  (&local_150,&pWVar1->i18n,&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
        PacketBuilder::AddString((PacketBuilder *)local_130,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator(&local_171);
        break;
      default:
        PacketBuilder::AddString((PacketBuilder *)local_130,(string *)local_e0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270," ",&local_271);
      PacketBuilder::AddString((PacketBuilder *)local_130,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      Character::PaddedGuildTag_abi_cxx11_((string *)&__range3,local_20);
      util::trim(&local_298,(string *)&__range3);
      PacketBuilder::AddBreakString((PacketBuilder *)local_130,&local_298,0xff);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&__range3);
      iVar6 = Character::Usage(local_20);
      PacketBuilder::AddInt((PacketBuilder *)local_130,iVar6);
      PacketBuilder::AddByte((PacketBuilder *)local_130,0xff);
      PacketBuilder::AddInt((PacketBuilder *)local_130,local_20->goldbank);
      PacketBuilder::AddByte((PacketBuilder *)local_130,0xff);
      plVar13 = &local_20->inventory;
      __end3 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin(plVar13);
      item = (Character_Item)
             std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end(plVar13);
      while (bVar4 = std::operator!=(&__end3,(_Self *)&item), bVar4) {
        pCVar14 = std::_List_iterator<Character_Item>::operator*(&__end3);
        CVar2 = *pCVar14;
        __range3_1._0_2_ = CVar2.id;
        PacketBuilder::AddShort((PacketBuilder *)local_130,(int)(short)__range3_1);
        __range3_1._4_4_ = CVar2.amount;
        PacketBuilder::AddInt((PacketBuilder *)local_130,__range3_1._4_4_);
        std::_List_iterator<Character_Item>::operator++(&__end3);
      }
      PacketBuilder::AddByte((PacketBuilder *)local_130,0xff);
      plVar13 = &local_20->bank;
      __end3_1 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin(plVar13)
      ;
      item_1 = (Character_Item)
               std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end(plVar13);
      while (bVar4 = std::operator!=(&__end3_1,(_Self *)&item_1), bVar4) {
        pCVar14 = std::_List_iterator<Character_Item>::operator*(&__end3_1);
        local_2f8 = *pCVar14;
        PacketBuilder::AddShort((PacketBuilder *)local_130,(int)local_2f8.id);
        PacketBuilder::AddThree((PacketBuilder *)local_130,local_2f8.amount);
        std::_List_iterator<Character_Item>::operator++(&__end3_1);
      }
      Character::Send(victim,(PacketBuilder *)local_130);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_130);
      std::__cxx11::string::~string((string *)local_e0);
    }
    else {
      pWVar1 = victim->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,"command_access_denied",&local_339);
      I18N::Format<>(&local_318,&pWVar1->i18n,&local_338);
      (*(pCVar3->super_Command_Source)._vptr_Command_Source[5])(pCVar3,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator(&local_339);
    }
  }
  return;
}

Assistant:

void Inventory(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < int(from->world->admin_config["cmdprotect"])
		 || victim->SourceAccess() <= from->SourceAccess())
		{
			std::string name = util::ucfirst(victim->SourceName());

			PacketBuilder reply(PACKET_ADMININTERACT, PACKET_LIST, 32 + name.length() + victim->inventory.size() * 6 + victim->bank.size() * 7);

			switch (victim->admin)
			{
				case ADMIN_HGM:      reply.AddString(from->world->i18n.Format("high_game_master_title", name)); break;
				case ADMIN_GM:       reply.AddString(from->world->i18n.Format("game_master_title", name)); break;
				case ADMIN_GUARDIAN: reply.AddString(from->world->i18n.Format("guardian_title", name)); break;
				case ADMIN_GUIDE:    reply.AddString(from->world->i18n.Format("light_guide_title", name)); break;
				default:             reply.AddString(name); break;
			}

			reply.AddString(" ");
			reply.AddBreakString(util::trim(victim->PaddedGuildTag()));
			reply.AddInt(victim->Usage());
			reply.AddByte(255);
			reply.AddInt(victim->goldbank);
			reply.AddByte(255);

			UTIL_FOREACH(victim->inventory, item)
			{
				reply.AddShort(item.id);
				reply.AddInt(item.amount);
			}
			reply.AddByte(255);

			UTIL_FOREACH(victim->bank, item)
			{
				reply.AddShort(item.id);
				reply.AddThree(item.amount);
			}

			from->Send(reply);
		}
		else
		{
			from->ServerMsg(from->world->i18n.Format("command_access_denied"));
		}
	}
}